

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

APInt __thiscall llvm::APInt::ssub_ov(APInt *this,APInt *RHS,bool *Overflow)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  anon_union_8_2_1313ab2f_for_U __dest;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  ulong __n;
  APInt AVar5;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  
  local_38 = RHS->BitWidth;
  if ((ulong)local_38 < 0x41) {
    __dest = RHS->U;
  }
  else {
    __n = (ulong)((uint)((ulong)local_38 + 0x3f >> 3) & 0xfffffff8);
    __dest.pVal = (uint64_t *)operator_new__(__n);
    memcpy(__dest.pVal,(RHS->U).pVal,__n);
  }
  local_40 = __dest;
  operator-=((APInt *)&local_40,(APInt *)Overflow);
  uVar1 = local_38;
  this->BitWidth = local_38;
  this->U = local_40;
  local_38 = 0;
  bVar2 = operator[](RHS,RHS->BitWidth - 1);
  bVar3 = operator[]((APInt *)Overflow,*(int *)(Overflow + 8) - 1);
  if (bVar2 == bVar3) {
    bVar2 = false;
    uVar4 = extraout_RDX;
  }
  else {
    bVar2 = operator[](this,uVar1 - 1);
    bVar3 = operator[](RHS,RHS->BitWidth - 1);
    bVar2 = bVar3 != bVar2;
    uVar4 = extraout_RDX_00;
  }
  *(bool *)in_RCX = bVar2;
  AVar5._8_8_ = uVar4;
  AVar5.U.pVal = (uint64_t *)this;
  return AVar5;
}

Assistant:

APInt APInt::ssub_ov(const APInt &RHS, bool &Overflow) const {
  APInt Res = *this - RHS;
  Overflow = isNonNegative() != RHS.isNonNegative() &&
             Res.isNonNegative() != isNonNegative();
  return Res;
}